

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O3

void advance_array_seg(uint nxtpage)

{
  LispPTR base;
  uint block;
  uint uVar1;
  
  block = *ArrayFrLst_word;
  uVar1 = (((~block >> 8 | 0x1f00000) + *Next_Array_word) * 0x80 - (block >> 1 & 0x7f)) + 0x80;
  if (3 < uVar1) {
    base = makefreearrayblock(block,(DLword)uVar1);
    mergebackward(base);
    block = *LeastMDSPage_word << 8;
  }
  *ArrayFrLst2_word = block;
  *Next_Array_word = nxtpage & 0xfffff;
  *ArrayFrLst_word = (nxtpage & 0xfffff) << 8;
  *ArraySpace2_word = *ArrayFrLst_word;
  return;
}

Assistant:

static void advance_array_seg(unsigned int nxtpage)
/* rare page num */
{
  unsigned int ncellsleft;

/* Called when 8Mb are exhausted,and we want to switch array space
 into the extended area(Secondary space),starting with nextpage.
 We MUST clean up old area first.   */

#ifdef BIGVM
  nxtpage &= 0xFFFFF; /* new VM, limit is 20 bits of page */
#else
  nxtpage &= 0xFFFF; /* for old VM size, limit is 16 bits of page */
#endif

  ncellsleft = (*Next_Array_word - POINTER_PAGE(*ArrayFrLst_word) - 1) * CELLSPER_PAGE +
               (CELLSPER_PAGE - (((*ArrayFrLst_word) & 0xff) >> 1));

  if (ncellsleft >= MINARRAYBLOCKSIZE) {
    mergebackward(makefreearrayblock(*ArrayFrLst_word, ncellsleft));
#ifdef BIGVM
    *ArrayFrLst2_word = (((*LeastMDSPage_word)) << 8);
#else
    *ArrayFrLst2_word = (((*LeastMDSPage_word) & 0xffff) << 8);
#endif
  } else {
    *ArrayFrLst2_word = *ArrayFrLst_word;
  }
#ifdef BIGVM
  *Next_Array_word = nxtpage;
#else
  *Next_Array_word = S_POSITIVE | nxtpage;
#endif
  *ArrayFrLst_word = nxtpage << 8;
  *ArraySpace2_word = *ArrayFrLst_word;

  /* return(S_POSITIVE); making function void as result never used */

}